

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getNameAndInt(int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  invalid_argument *this;
  string *name;
  int in_ECX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  SetAttr *in_R8;
  int j;
  char *attrName;
  value_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  if (in_EDI + -3 < *in_RDX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a name and an integer");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  strtol(*(char **)(in_RSI + 0x10 + (long)*in_RDX * 8),(char **)0x0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  name = (string *)operator_new(0x10);
  Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)name);
  SetAttr::SetAttr(in_R8,name,in_ECX,(Attribute *)in_stack_ffffffffffffff28);
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            ((vector<SetAttr,_std::allocator<SetAttr>_> *)CONCAT44(in_ECX,in_stack_ffffffffffffff30)
             ,in_stack_ffffffffffffff28);
  SetAttr::~SetAttr((SetAttr *)0x1065df);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  *in_RDX = *in_RDX + 3;
  return;
}

Assistant:

void
getNameAndInt (int argc, char** argv, int& i, int part, SetAttrVector& attrs)
{
    if (i > argc - 3) throw invalid_argument ("Expected a name and an integer");

    const char* attrName = argv[i + 1];
    int         j        = strtol (argv[i + 2], 0, 0);
    attrs.push_back (SetAttr (attrName, part, new IntAttribute (j)));
    i += 3;
}